

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  pointer puVar1;
  Command *base;
  AssertModuleCommand<(wabt::CommandType)5> *pAVar2;
  ScriptModuleCommand *pSVar3;
  AssertModuleCommand<(wabt::CommandType)6> *pAVar4;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  pointer puVar5;
  Errors errors_1;
  NameResolver resolver;
  Errors local_1a8;
  NameResolver local_190;
  NameResolver local_e0;
  
  anon_unknown_16::NameResolver::NameResolver(&local_190,script,errors);
  puVar5 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      anon_unknown_16::NameResolver::~NameResolver(&local_190);
      return (Result)local_190.result_.enum_;
    }
    base = (puVar5->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
           _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
           super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    switch(base->type) {
    case First:
      pSVar3 = (ScriptModuleCommand *)cast<wabt::ModuleCommand,wabt::Command>(base);
      goto LAB_0015c4bb;
    case ScriptModule:
      pSVar3 = cast<wabt::ScriptModuleCommand,wabt::Command>(base);
LAB_0015c4bb:
      anon_unknown_16::NameResolver::VisitModule(&local_190,&pSVar3->module);
      break;
    case AssertInvalid:
      pAVar2 = cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(base);
      local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      anon_unknown_16::NameResolver::NameResolver(&local_e0,local_190.script_,&local_1a8);
      anon_unknown_16::NameResolver::VisitScriptModule
                (&local_e0,
                 (pAVar2->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
      anon_unknown_16::NameResolver::~NameResolver(&local_e0);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_1a8);
      break;
    case AssertUnlinkable:
      pAVar4 = cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(base);
      goto LAB_0015c4d5;
    case AssertUninstantiable:
      pAVar4 = (AssertModuleCommand<(wabt::CommandType)6> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)7>,wabt::Command>(base);
LAB_0015c4d5:
      anon_unknown_16::NameResolver::VisitScriptModule
                (&local_190,
                 (pAVar4->module)._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}